

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConfigureLog.cxx
# Opt level: O2

void __thiscall cmConfigureLog::WriteValue(cmConfigureLog *this,string_view key,int value)

{
  ofstream *poVar1;
  ostream *poVar2;
  
  poVar1 = BeginLine(this);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,key._M_str,
                      key._M_len);
  poVar2 = std::operator<<(poVar2,": ");
  std::ostream::operator<<(poVar2,value);
  std::endl<char,std::char_traits<char>>
            (&(this->Stream).super_basic_ostream<char,_std::char_traits<char>_>);
  return;
}

Assistant:

void cmConfigureLog::WriteValue(cm::string_view key, int value)
{
  this->BeginLine() << key << ": " << value;
  this->EndLine();
}